

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O1

void run_eckey_edge_case_test(void)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  secp256k1_context *extraout_RAX;
  secp256k1_context *psVar6;
  secp256k1_context *extraout_RAX_00;
  long lVar7;
  char *pcVar8;
  int32_t ecount;
  size_t len;
  secp256k1_pubkey pubkey;
  unsigned_long _zzq_result_21;
  uchar ctmp [33];
  uchar ctmp2 [33];
  secp256k1_pubkey pubkey2;
  uchar zeros [64];
  uchar orderc [32];
  secp256k1_pubkey pubkey_one;
  unsigned_long _zzq_args_12 [6];
  secp256k1_pubkey *pubkeys [3];
  secp256k1_pubkey pubkey_negone;
  int local_254;
  size_t local_250;
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  undefined8 local_200;
  byte local_1f8 [8];
  uchar auStack_1f0 [16];
  undefined8 uStack_1e0;
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  uchar local_178 [24];
  uchar auStack_160 [8];
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  byte local_118 [8];
  uchar auStack_110 [24];
  secp256k1_pubkey local_f8;
  undefined8 local_b8;
  secp256k1_pubkey *local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  secp256k1_pubkey *local_88;
  secp256k1_pubkey *local_80;
  secp256k1_pubkey *local_78;
  secp256k1_pubkey local_68;
  
  auStack_110[8] = 0xba;
  auStack_110[9] = 0xae;
  auStack_110[10] = 0xdc;
  auStack_110[0xb] = 0xe6;
  auStack_110[0xc] = 0xaf;
  auStack_110[0xd] = 'H';
  auStack_110[0xe] = 0xa0;
  auStack_110[0xf] = ';';
  auStack_110[0x10] = 0xbf;
  auStack_110[0x11] = 0xd2;
  auStack_110[0x12] = '^';
  auStack_110[0x13] = 0x8c;
  auStack_110[0x14] = 0xd0;
  auStack_110[0x15] = '6';
  auStack_110[0x16] = 'A';
  auStack_110[0x17] = 'A';
  local_118[0] = 0xff;
  local_118[1] = 0xff;
  local_118[2] = 0xff;
  local_118[3] = 0xff;
  local_118[4] = 0xff;
  local_118[5] = 0xff;
  local_118[6] = 0xff;
  local_118[7] = 0xff;
  auStack_110[0] = 0xff;
  auStack_110[1] = 0xff;
  auStack_110[2] = 0xff;
  auStack_110[3] = 0xff;
  auStack_110[4] = 0xff;
  auStack_110[5] = 0xff;
  auStack_110[6] = 0xff;
  auStack_110[7] = 0xfe;
  local_128 = (undefined1  [16])0x0;
  local_138 = (undefined1  [16])0x0;
  local_148 = (undefined1  [16])0x0;
  local_158 = (undefined1  [16])0x0;
  iVar5 = secp256k1_ec_seckey_verify(CTX,local_118);
  if (iVar5 == 0) {
    local_198._8_8_ = (secp256k1_pubkey *)local_248;
    local_198._0_8_ = 0x4d430001;
    local_188 = ZEXT816(0x40);
    local_178[0] = '\0';
    local_178[1] = '\0';
    local_178[2] = '\0';
    local_178[3] = '\0';
    local_178[4] = '\0';
    local_178[5] = '\0';
    local_178[6] = '\0';
    local_178[7] = '\0';
    local_178[8] = '\0';
    local_178[9] = '\0';
    local_178[10] = '\0';
    local_178[0xb] = '\0';
    local_178[0xc] = '\0';
    local_178[0xd] = '\0';
    local_178[0xe] = '\0';
    local_178[0xf] = '\0';
    local_f8.data[0] = '\0';
    local_f8.data[1] = '\0';
    local_f8.data[2] = '\0';
    local_f8.data[3] = '\0';
    local_f8.data[4] = '\0';
    local_f8.data[5] = '\0';
    local_f8.data[6] = '\0';
    local_f8.data[7] = '\0';
    iVar5 = secp256k1_ec_pubkey_create(CTX,(secp256k1_pubkey *)local_248,local_118);
    if (iVar5 != 0) goto LAB_001400f4;
    local_198._0_8_ = 0x4d430005;
    lVar7 = 0;
    local_188 = ZEXT816(0x40);
    local_178[0] = '\0';
    local_178[1] = '\0';
    local_178[2] = '\0';
    local_178[3] = '\0';
    local_178[4] = '\0';
    local_178[5] = '\0';
    local_178[6] = '\0';
    local_178[7] = '\0';
    local_178[8] = '\0';
    local_178[9] = '\0';
    local_178[10] = '\0';
    local_178[0xb] = '\0';
    local_178[0xc] = '\0';
    local_178[0xd] = '\0';
    local_178[0xe] = '\0';
    local_178[0xf] = '\0';
    local_f8.data[0] = '\0';
    local_f8.data[1] = '\0';
    local_f8.data[2] = '\0';
    local_f8.data[3] = '\0';
    local_f8.data[4] = '\0';
    local_f8.data[5] = '\0';
    local_f8.data[6] = '\0';
    local_f8.data[7] = '\0';
    do {
      iVar5 = (uint)(byte)local_248[lVar7] - (uint)(byte)local_158[lVar7];
      if (local_248[lVar7] != local_158[lVar7]) goto LAB_0013e69f;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x40);
    iVar5 = 0;
LAB_0013e69f:
    if (iVar5 != 0) goto LAB_001400f9;
    auStack_1f0[8] = 0xff;
    auStack_1f0[9] = 0xff;
    auStack_1f0[10] = 0xff;
    auStack_1f0[0xb] = 0xff;
    auStack_1f0[0xc] = 0xff;
    auStack_1f0[0xd] = 0xff;
    auStack_1f0[0xe] = 0xff;
    auStack_1f0[0xf] = 0xff;
    uStack_1e0._0_1_ = 0xff;
    uStack_1e0._1_1_ = 0xff;
    uStack_1e0._2_1_ = 0xff;
    uStack_1e0._3_1_ = 0xff;
    uStack_1e0._4_1_ = 0xff;
    uStack_1e0._5_1_ = 0xff;
    uStack_1e0._6_1_ = 0xff;
    uStack_1e0._7_1_ = 0xff;
    local_1f8[0] = 0xff;
    local_1f8[1] = 0xff;
    local_1f8[2] = 0xff;
    local_1f8[3] = 0xff;
    local_1f8[4] = 0xff;
    local_1f8[5] = 0xff;
    local_1f8[6] = 0xff;
    local_1f8[7] = 0xff;
    auStack_1f0[0] = 0xff;
    auStack_1f0[1] = 0xff;
    auStack_1f0[2] = 0xff;
    auStack_1f0[3] = 0xff;
    auStack_1f0[4] = 0xff;
    auStack_1f0[5] = 0xff;
    auStack_1f0[6] = 0xff;
    auStack_1f0[7] = 0xff;
    iVar5 = secp256k1_ec_seckey_verify(CTX,local_1f8);
    if (iVar5 != 0) goto LAB_001400fe;
    local_218._8_8_ = 0x101010101010101;
    local_218._0_8_ = 0x101010101010101;
    local_228._8_8_ = 0x101010101010101;
    local_228._0_8_ = 0x101010101010101;
    local_238._8_8_ = 0x101010101010101;
    local_238._0_8_ = 0x101010101010101;
    local_248._8_8_ = 0x101010101010101;
    local_248._0_8_ = 0x101010101010101;
    local_198._0_8_ = 0x4d430001;
    local_188 = ZEXT816(0x40);
    local_178[0] = '\0';
    local_178[1] = '\0';
    local_178[2] = '\0';
    local_178[3] = '\0';
    local_178[4] = '\0';
    local_178[5] = '\0';
    local_178[6] = '\0';
    local_178[7] = '\0';
    local_178[8] = '\0';
    local_178[9] = '\0';
    local_178[10] = '\0';
    local_178[0xb] = '\0';
    local_178[0xc] = '\0';
    local_178[0xd] = '\0';
    local_178[0xe] = '\0';
    local_178[0xf] = '\0';
    local_f8.data[0] = '\0';
    local_f8.data[1] = '\0';
    local_f8.data[2] = '\0';
    local_f8.data[3] = '\0';
    local_f8.data[4] = '\0';
    local_f8.data[5] = '\0';
    local_f8.data[6] = '\0';
    local_f8.data[7] = '\0';
    iVar5 = secp256k1_ec_pubkey_create(CTX,(secp256k1_pubkey *)local_248,local_1f8);
    if (iVar5 != 0) goto LAB_00140103;
    local_198._0_8_ = 0x4d430005;
    lVar7 = 0;
    local_188 = ZEXT816(0x40);
    local_178[0] = '\0';
    local_178[1] = '\0';
    local_178[2] = '\0';
    local_178[3] = '\0';
    local_178[4] = '\0';
    local_178[5] = '\0';
    local_178[6] = '\0';
    local_178[7] = '\0';
    local_178[8] = '\0';
    local_178[9] = '\0';
    local_178[10] = '\0';
    local_178[0xb] = '\0';
    local_178[0xc] = '\0';
    local_178[0xd] = '\0';
    local_178[0xe] = '\0';
    local_178[0xf] = '\0';
    local_f8.data[0] = '\0';
    local_f8.data[1] = '\0';
    local_f8.data[2] = '\0';
    local_f8.data[3] = '\0';
    local_f8.data[4] = '\0';
    local_f8.data[5] = '\0';
    local_f8.data[6] = '\0';
    local_f8.data[7] = '\0';
    do {
      iVar5 = (uint)(byte)local_248[lVar7] - (uint)(byte)local_158[lVar7];
      if (local_248[lVar7] != local_158[lVar7]) goto LAB_0013e7c6;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x40);
    iVar5 = 0;
LAB_0013e7c6:
    if (iVar5 != 0) goto LAB_00140108;
    auStack_1f0[8] = '\0';
    auStack_1f0[9] = '\0';
    auStack_1f0[10] = '\0';
    auStack_1f0[0xb] = '\0';
    auStack_1f0[0xc] = '\0';
    auStack_1f0[0xd] = '\0';
    auStack_1f0[0xe] = '\0';
    auStack_1f0[0xf] = '\0';
    uStack_1e0._0_1_ = '\0';
    uStack_1e0._1_1_ = '\0';
    uStack_1e0._2_1_ = '\0';
    uStack_1e0._3_1_ = '\0';
    uStack_1e0._4_1_ = '\0';
    uStack_1e0._5_1_ = '\0';
    uStack_1e0._6_1_ = '\0';
    uStack_1e0._7_1_ = '\0';
    local_1f8[0] = '\0';
    local_1f8[1] = '\0';
    local_1f8[2] = '\0';
    local_1f8[3] = '\0';
    local_1f8[4] = '\0';
    local_1f8[5] = '\0';
    local_1f8[6] = '\0';
    local_1f8[7] = '\0';
    auStack_1f0[0] = '\0';
    auStack_1f0[1] = '\0';
    auStack_1f0[2] = '\0';
    auStack_1f0[3] = '\0';
    auStack_1f0[4] = '\0';
    auStack_1f0[5] = '\0';
    auStack_1f0[6] = '\0';
    auStack_1f0[7] = '\0';
    iVar5 = secp256k1_ec_seckey_verify(CTX,local_1f8);
    if (iVar5 != 0) goto LAB_0014010d;
    local_218._8_8_ = 0x101010101010101;
    local_218._0_8_ = 0x101010101010101;
    local_228._8_8_ = 0x101010101010101;
    local_228._0_8_ = 0x101010101010101;
    local_238._8_8_ = 0x101010101010101;
    local_238._0_8_ = 0x101010101010101;
    local_248._8_8_ = 0x101010101010101;
    local_248._0_8_ = 0x101010101010101;
    local_198._0_8_ = 0x4d430001;
    local_188 = ZEXT816(0x40);
    local_178[0] = '\0';
    local_178[1] = '\0';
    local_178[2] = '\0';
    local_178[3] = '\0';
    local_178[4] = '\0';
    local_178[5] = '\0';
    local_178[6] = '\0';
    local_178[7] = '\0';
    local_178[8] = '\0';
    local_178[9] = '\0';
    local_178[10] = '\0';
    local_178[0xb] = '\0';
    local_178[0xc] = '\0';
    local_178[0xd] = '\0';
    local_178[0xe] = '\0';
    local_178[0xf] = '\0';
    local_f8.data[0] = '\0';
    local_f8.data[1] = '\0';
    local_f8.data[2] = '\0';
    local_f8.data[3] = '\0';
    local_f8.data[4] = '\0';
    local_f8.data[5] = '\0';
    local_f8.data[6] = '\0';
    local_f8.data[7] = '\0';
    iVar5 = secp256k1_ec_pubkey_create(CTX,(secp256k1_pubkey *)local_248,local_1f8);
    if (iVar5 != 0) goto LAB_00140112;
    local_198._0_8_ = 0x4d430005;
    lVar7 = 0;
    local_188 = ZEXT816(0x40);
    local_178[0] = '\0';
    local_178[1] = '\0';
    local_178[2] = '\0';
    local_178[3] = '\0';
    local_178[4] = '\0';
    local_178[5] = '\0';
    local_178[6] = '\0';
    local_178[7] = '\0';
    local_178[8] = '\0';
    local_178[9] = '\0';
    local_178[10] = '\0';
    local_178[0xb] = '\0';
    local_178[0xc] = '\0';
    local_178[0xd] = '\0';
    local_178[0xe] = '\0';
    local_178[0xf] = '\0';
    local_f8.data[0] = '\0';
    local_f8.data[1] = '\0';
    local_f8.data[2] = '\0';
    local_f8.data[3] = '\0';
    local_f8.data[4] = '\0';
    local_f8.data[5] = '\0';
    local_f8.data[6] = '\0';
    local_f8.data[7] = '\0';
    do {
      iVar5 = (uint)(byte)local_248[lVar7] - (uint)(byte)local_158[lVar7];
      if (local_248[lVar7] != local_158[lVar7]) goto LAB_0013e8ea;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x40);
    iVar5 = 0;
LAB_0013e8ea:
    if (iVar5 != 0) goto LAB_00140117;
    uStack_1e0._7_1_ = '\x01';
    iVar5 = secp256k1_ec_seckey_verify(CTX,local_1f8);
    if (iVar5 == 0) goto LAB_0014011c;
    local_218 = ZEXT816(0);
    local_228 = ZEXT816(0);
    local_238 = ZEXT816(0);
    local_248 = ZEXT816(0);
    local_198._0_8_ = 0x4d430001;
    local_188 = ZEXT816(0x40);
    local_178[0] = '\0';
    local_178[1] = '\0';
    local_178[2] = '\0';
    local_178[3] = '\0';
    local_178[4] = '\0';
    local_178[5] = '\0';
    local_178[6] = '\0';
    local_178[7] = '\0';
    local_178[8] = '\0';
    local_178[9] = '\0';
    local_178[10] = '\0';
    local_178[0xb] = '\0';
    local_178[0xc] = '\0';
    local_178[0xd] = '\0';
    local_178[0xe] = '\0';
    local_178[0xf] = '\0';
    local_f8.data[0] = '\0';
    local_f8.data[1] = '\0';
    local_f8.data[2] = '\0';
    local_f8.data[3] = '\0';
    local_f8.data[4] = '\0';
    local_f8.data[5] = '\0';
    local_f8.data[6] = '\0';
    local_f8.data[7] = '\0';
    iVar5 = secp256k1_ec_pubkey_create(CTX,(secp256k1_pubkey *)local_248,local_1f8);
    auVar4 = local_218;
    auVar3 = local_228;
    auVar2 = local_238;
    auVar1 = local_248;
    if (iVar5 == 0) goto LAB_00140121;
    local_198._0_8_ = 0x4d430005;
    lVar7 = 0;
    local_188 = ZEXT816(0x40);
    local_178[0] = '\0';
    local_178[1] = '\0';
    local_178[2] = '\0';
    local_178[3] = '\0';
    local_178[4] = '\0';
    local_178[5] = '\0';
    local_178[6] = '\0';
    local_178[7] = '\0';
    local_178[8] = '\0';
    local_178[9] = '\0';
    local_178[10] = '\0';
    local_178[0xb] = '\0';
    local_178[0xc] = '\0';
    local_178[0xd] = '\0';
    local_178[0xe] = '\0';
    local_178[0xf] = '\0';
    local_f8.data[0] = '\0';
    local_f8.data[1] = '\0';
    local_f8.data[2] = '\0';
    local_f8.data[3] = '\0';
    local_f8.data[4] = '\0';
    local_f8.data[5] = '\0';
    local_f8.data[6] = '\0';
    local_f8.data[7] = '\0';
    do {
      iVar5 = (uint)(byte)local_248[lVar7] - (uint)(byte)local_158[lVar7];
      if (local_248[lVar7] != local_158[lVar7]) goto LAB_0013ea04;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x40);
    iVar5 = 0;
LAB_0013ea04:
    if (iVar5 < 1) goto LAB_00140126;
    local_f8.data[0x30] = local_218[0];
    local_f8.data[0x31] = local_218[1];
    local_f8.data[0x32] = local_218[2];
    local_f8.data[0x33] = local_218[3];
    local_f8.data[0x34] = local_218[4];
    local_f8.data[0x35] = local_218[5];
    local_f8.data[0x36] = local_218[6];
    local_f8.data[0x37] = local_218[7];
    local_f8.data[0x38] = local_218[8];
    local_f8.data[0x39] = local_218[9];
    local_f8.data[0x3a] = local_218[10];
    local_f8.data[0x3b] = local_218[0xb];
    local_f8.data[0x3c] = local_218[0xc];
    local_f8.data[0x3d] = local_218[0xd];
    local_f8.data[0x3e] = local_218[0xe];
    local_f8.data[0x3f] = local_218[0xf];
    local_f8.data[0x20] = local_228[0];
    local_f8.data[0x21] = local_228[1];
    local_f8.data[0x22] = local_228[2];
    local_f8.data[0x23] = local_228[3];
    local_f8.data[0x24] = local_228[4];
    local_f8.data[0x25] = local_228[5];
    local_f8.data[0x26] = local_228[6];
    local_f8.data[0x27] = local_228[7];
    local_f8.data[0x28] = local_228[8];
    local_f8.data[0x29] = local_228[9];
    local_f8.data[0x2a] = local_228[10];
    local_f8.data[0x2b] = local_228[0xb];
    local_f8.data[0x2c] = local_228[0xc];
    local_f8.data[0x2d] = local_228[0xd];
    local_f8.data[0x2e] = local_228[0xe];
    local_f8.data[0x2f] = local_228[0xf];
    local_f8.data[0x10] = local_238[0];
    local_f8.data[0x11] = local_238[1];
    local_f8.data[0x12] = local_238[2];
    local_f8.data[0x13] = local_238[3];
    local_f8.data[0x14] = local_238[4];
    local_f8.data[0x15] = local_238[5];
    local_f8.data[0x16] = local_238[6];
    local_f8.data[0x17] = local_238[7];
    local_f8.data[0x18] = local_238[8];
    local_f8.data[0x19] = local_238[9];
    local_f8.data[0x1a] = local_238[10];
    local_f8.data[0x1b] = local_238[0xb];
    local_f8.data[0x1c] = local_238[0xc];
    local_f8.data[0x1d] = local_238[0xd];
    local_f8.data[0x1e] = local_238[0xe];
    local_f8.data[0x1f] = local_238[0xf];
    local_f8.data[0] = local_248[0];
    local_f8.data[1] = local_248[1];
    local_f8.data[2] = local_248[2];
    local_f8.data[3] = local_248[3];
    local_f8.data[4] = local_248[4];
    local_f8.data[5] = local_248[5];
    local_f8.data[6] = local_248[6];
    local_f8.data[7] = local_248[7];
    local_f8.data[8] = local_248[8];
    local_f8.data[9] = local_248[9];
    local_f8.data[10] = local_248[10];
    local_f8.data[0xb] = local_248[0xb];
    local_f8.data[0xc] = local_248[0xc];
    local_f8.data[0xd] = local_248[0xd];
    local_f8.data[0xe] = local_248[0xe];
    local_f8.data[0xf] = local_248[0xf];
    auStack_1f0[8] = auStack_110[8];
    auStack_1f0[9] = auStack_110[9];
    auStack_1f0[10] = auStack_110[10];
    auStack_1f0[0xb] = auStack_110[0xb];
    auStack_1f0[0xc] = auStack_110[0xc];
    auStack_1f0[0xd] = auStack_110[0xd];
    auStack_1f0[0xe] = auStack_110[0xe];
    auStack_1f0[0xf] = auStack_110[0xf];
    local_1f8[0] = local_118[0];
    local_1f8[1] = local_118[1];
    local_1f8[2] = local_118[2];
    local_1f8[3] = local_118[3];
    local_1f8[4] = local_118[4];
    local_1f8[5] = local_118[5];
    local_1f8[6] = local_118[6];
    local_1f8[7] = local_118[7];
    auStack_1f0[0] = auStack_110[0];
    auStack_1f0[1] = auStack_110[1];
    auStack_1f0[2] = auStack_110[2];
    auStack_1f0[3] = auStack_110[3];
    auStack_1f0[4] = auStack_110[4];
    auStack_1f0[5] = auStack_110[5];
    auStack_1f0[6] = auStack_110[6];
    auStack_1f0[7] = auStack_110[7];
    uStack_1e0._0_7_ = (undefined7)auStack_110._16_8_;
    uStack_1e0._7_1_ = 'B';
    local_248 = auVar1;
    local_238 = auVar2;
    local_228 = auVar3;
    local_218 = auVar4;
    iVar5 = secp256k1_ec_seckey_verify(CTX,local_1f8);
    if (iVar5 != 0) goto LAB_0014012b;
    local_218._8_8_ = 0x101010101010101;
    local_218._0_8_ = 0x101010101010101;
    local_228._8_8_ = 0x101010101010101;
    local_228._0_8_ = 0x101010101010101;
    local_238._8_8_ = 0x101010101010101;
    local_238._0_8_ = 0x101010101010101;
    local_248._8_8_ = 0x101010101010101;
    local_248._0_8_ = 0x101010101010101;
    local_198._0_8_ = 0x4d430001;
    local_188 = ZEXT816(0x40);
    local_178[0] = '\0';
    local_178[1] = '\0';
    local_178[2] = '\0';
    local_178[3] = '\0';
    local_178[4] = '\0';
    local_178[5] = '\0';
    local_178[6] = '\0';
    local_178[7] = '\0';
    local_178[8] = '\0';
    local_178[9] = '\0';
    local_178[10] = '\0';
    local_178[0xb] = '\0';
    local_178[0xc] = '\0';
    local_178[0xd] = '\0';
    local_178[0xe] = '\0';
    local_178[0xf] = '\0';
    local_68.data[0] = '\0';
    local_68.data[1] = '\0';
    local_68.data[2] = '\0';
    local_68.data[3] = '\0';
    local_68.data[4] = '\0';
    local_68.data[5] = '\0';
    local_68.data[6] = '\0';
    local_68.data[7] = '\0';
    iVar5 = secp256k1_ec_pubkey_create(CTX,(secp256k1_pubkey *)local_248,local_1f8);
    if (iVar5 != 0) goto LAB_00140130;
    local_198._0_8_ = 0x4d430005;
    lVar7 = 0;
    local_188 = ZEXT816(0x40);
    local_178[0] = '\0';
    local_178[1] = '\0';
    local_178[2] = '\0';
    local_178[3] = '\0';
    local_178[4] = '\0';
    local_178[5] = '\0';
    local_178[6] = '\0';
    local_178[7] = '\0';
    local_178[8] = '\0';
    local_178[9] = '\0';
    local_178[10] = '\0';
    local_178[0xb] = '\0';
    local_178[0xc] = '\0';
    local_178[0xd] = '\0';
    local_178[0xe] = '\0';
    local_178[0xf] = '\0';
    local_68.data[0] = '\0';
    local_68.data[1] = '\0';
    local_68.data[2] = '\0';
    local_68.data[3] = '\0';
    local_68.data[4] = '\0';
    local_68.data[5] = '\0';
    local_68.data[6] = '\0';
    local_68.data[7] = '\0';
    do {
      iVar5 = (uint)(byte)local_248[lVar7] - (uint)(byte)local_158[lVar7];
      if (local_248[lVar7] != local_158[lVar7]) goto LAB_0013eb6d;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x40);
    iVar5 = 0;
LAB_0013eb6d:
    if (iVar5 != 0) goto LAB_00140135;
    uStack_1e0._7_1_ = '@';
    iVar5 = secp256k1_ec_seckey_verify(CTX,local_1f8);
    if (iVar5 == 0) goto LAB_0014013a;
    local_218 = ZEXT816(0);
    local_228 = ZEXT816(0);
    local_238 = ZEXT816(0);
    local_248 = ZEXT816(0);
    local_198._0_8_ = 0x4d430001;
    local_188 = ZEXT816(0x40);
    local_178[0] = '\0';
    local_178[1] = '\0';
    local_178[2] = '\0';
    local_178[3] = '\0';
    local_178[4] = '\0';
    local_178[5] = '\0';
    local_178[6] = '\0';
    local_178[7] = '\0';
    local_178[8] = '\0';
    local_178[9] = '\0';
    local_178[10] = '\0';
    local_178[0xb] = '\0';
    local_178[0xc] = '\0';
    local_178[0xd] = '\0';
    local_178[0xe] = '\0';
    local_178[0xf] = '\0';
    local_68.data[0] = '\0';
    local_68.data[1] = '\0';
    local_68.data[2] = '\0';
    local_68.data[3] = '\0';
    local_68.data[4] = '\0';
    local_68.data[5] = '\0';
    local_68.data[6] = '\0';
    local_68.data[7] = '\0';
    iVar5 = secp256k1_ec_pubkey_create(CTX,(secp256k1_pubkey *)local_248,local_1f8);
    auVar4 = local_218;
    auVar3 = local_228;
    auVar2 = local_238;
    auVar1 = local_248;
    if (iVar5 == 0) goto LAB_0014013f;
    local_198._0_8_ = 0x4d430005;
    lVar7 = 0;
    local_188 = ZEXT816(0x40);
    local_178[0] = '\0';
    local_178[1] = '\0';
    local_178[2] = '\0';
    local_178[3] = '\0';
    local_178[4] = '\0';
    local_178[5] = '\0';
    local_178[6] = '\0';
    local_178[7] = '\0';
    local_178[8] = '\0';
    local_178[9] = '\0';
    local_178[10] = '\0';
    local_178[0xb] = '\0';
    local_178[0xc] = '\0';
    local_178[0xd] = '\0';
    local_178[0xe] = '\0';
    local_178[0xf] = '\0';
    local_68.data[0] = '\0';
    local_68.data[1] = '\0';
    local_68.data[2] = '\0';
    local_68.data[3] = '\0';
    local_68.data[4] = '\0';
    local_68.data[5] = '\0';
    local_68.data[6] = '\0';
    local_68.data[7] = '\0';
    do {
      iVar5 = (uint)(byte)local_248[lVar7] - (uint)(byte)local_158[lVar7];
      if (local_248[lVar7] != local_158[lVar7]) goto LAB_0013ec87;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x40);
    iVar5 = 0;
LAB_0013ec87:
    if (iVar5 < 1) goto LAB_00140144;
    local_68.data[0x30] = local_218[0];
    local_68.data[0x31] = local_218[1];
    local_68.data[0x32] = local_218[2];
    local_68.data[0x33] = local_218[3];
    local_68.data[0x34] = local_218[4];
    local_68.data[0x35] = local_218[5];
    local_68.data[0x36] = local_218[6];
    local_68.data[0x37] = local_218[7];
    local_68.data[0x38] = local_218[8];
    local_68.data[0x39] = local_218[9];
    local_68.data[0x3a] = local_218[10];
    local_68.data[0x3b] = local_218[0xb];
    local_68.data[0x3c] = local_218[0xc];
    local_68.data[0x3d] = local_218[0xd];
    local_68.data[0x3e] = local_218[0xe];
    local_68.data[0x3f] = local_218[0xf];
    local_68.data[0x20] = local_228[0];
    local_68.data[0x21] = local_228[1];
    local_68.data[0x22] = local_228[2];
    local_68.data[0x23] = local_228[3];
    local_68.data[0x24] = local_228[4];
    local_68.data[0x25] = local_228[5];
    local_68.data[0x26] = local_228[6];
    local_68.data[0x27] = local_228[7];
    local_68.data[0x28] = local_228[8];
    local_68.data[0x29] = local_228[9];
    local_68.data[0x2a] = local_228[10];
    local_68.data[0x2b] = local_228[0xb];
    local_68.data[0x2c] = local_228[0xc];
    local_68.data[0x2d] = local_228[0xd];
    local_68.data[0x2e] = local_228[0xe];
    local_68.data[0x2f] = local_228[0xf];
    local_68.data[0x10] = local_238[0];
    local_68.data[0x11] = local_238[1];
    local_68.data[0x12] = local_238[2];
    local_68.data[0x13] = local_238[3];
    local_68.data[0x14] = local_238[4];
    local_68.data[0x15] = local_238[5];
    local_68.data[0x16] = local_238[6];
    local_68.data[0x17] = local_238[7];
    local_68.data[0x18] = local_238[8];
    local_68.data[0x19] = local_238[9];
    local_68.data[0x1a] = local_238[10];
    local_68.data[0x1b] = local_238[0xb];
    local_68.data[0x1c] = local_238[0xc];
    local_68.data[0x1d] = local_238[0xd];
    local_68.data[0x1e] = local_238[0xe];
    local_68.data[0x1f] = local_238[0xf];
    local_68.data[0] = local_248[0];
    local_68.data[1] = local_248[1];
    local_68.data[2] = local_248[2];
    local_68.data[3] = local_248[3];
    local_68.data[4] = local_248[4];
    local_68.data[5] = local_248[5];
    local_68.data[6] = local_248[6];
    local_68.data[7] = local_248[7];
    local_68.data[8] = local_248[8];
    local_68.data[9] = local_248[9];
    local_68.data[10] = local_248[10];
    local_68.data[0xb] = local_248[0xb];
    local_68.data[0xc] = local_248[0xc];
    local_68.data[0xd] = local_248[0xd];
    local_68.data[0xe] = local_248[0xe];
    local_68.data[0xf] = local_248[0xf];
    local_1c8 = ZEXT816(0);
    local_1b8 = ZEXT816(0);
    local_248 = auVar1;
    local_238 = auVar2;
    local_228 = auVar3;
    local_218 = auVar4;
    iVar5 = secp256k1_ec_seckey_tweak_add(CTX,local_1f8,local_1c8);
    auVar2 = local_218;
    auVar1 = local_228;
    if (iVar5 == 0) goto LAB_00140149;
    lVar7 = 0;
    do {
      iVar5 = (uint)local_118[lVar7] - (uint)local_1f8[lVar7];
      if (local_118[lVar7] != local_1f8[lVar7]) goto LAB_0013ed16;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x1f);
    iVar5 = 0;
LAB_0013ed16:
    if ((iVar5 != 0) || (uStack_1e0._7_1_ != '@')) goto LAB_0014014e;
    local_178[0x10] = local_218[0];
    local_178[0x11] = local_218[1];
    local_178[0x12] = local_218[2];
    local_178[0x13] = local_218[3];
    local_178[0x14] = local_218[4];
    local_178[0x15] = local_218[5];
    local_178[0x16] = local_218[6];
    local_178[0x17] = local_218[7];
    auStack_160[0] = local_218[8];
    auStack_160[1] = local_218[9];
    auStack_160[2] = local_218[10];
    auStack_160[3] = local_218[0xb];
    auStack_160[4] = local_218[0xc];
    auStack_160[5] = local_218[0xd];
    auStack_160[6] = local_218[0xe];
    auStack_160[7] = local_218[0xf];
    local_178[0] = local_228[0];
    local_178[1] = local_228[1];
    local_178[2] = local_228[2];
    local_178[3] = local_228[3];
    local_178[4] = local_228[4];
    local_178[5] = local_228[5];
    local_178[6] = local_228[6];
    local_178[7] = local_228[7];
    local_178[8] = local_228[8];
    local_178[9] = local_228[9];
    local_178[10] = local_228[10];
    local_178[0xb] = local_228[0xb];
    local_178[0xc] = local_228[0xc];
    local_178[0xd] = local_228[0xd];
    local_178[0xe] = local_228[0xe];
    local_178[0xf] = local_228[0xf];
    local_188 = local_238;
    local_198 = local_248;
    local_228 = auVar1;
    local_218 = auVar2;
    iVar5 = secp256k1_ec_pubkey_tweak_add(CTX,(secp256k1_pubkey *)local_248,local_1c8);
    if (iVar5 == 0) goto LAB_00140153;
    lVar7 = 0;
    do {
      iVar5 = (uint)(byte)local_248[lVar7] - (uint)(byte)local_198[lVar7];
      if (local_248[lVar7] != local_198[lVar7]) goto LAB_0013eda1;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x40);
    iVar5 = 0;
LAB_0013eda1:
    if (iVar5 != 0) goto LAB_00140158;
    iVar5 = secp256k1_ec_seckey_tweak_mul(CTX,local_1f8,local_1c8);
    if (iVar5 != 0) goto LAB_0014015d;
    lVar7 = 0;
    do {
      iVar5 = (uint)(byte)local_158[lVar7] - (uint)local_1f8[lVar7];
      if (local_158[lVar7] != local_1f8[lVar7]) goto LAB_0013edf2;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x20);
    iVar5 = 0;
LAB_0013edf2:
    if (iVar5 != 0) goto LAB_00140162;
    iVar5 = secp256k1_ec_pubkey_tweak_mul(CTX,(secp256k1_pubkey *)local_248,local_1c8);
    if (iVar5 != 0) goto LAB_00140167;
    lVar7 = 0;
    do {
      iVar5 = (uint)(byte)local_248[lVar7] - (uint)(byte)local_158[lVar7];
      if (local_248[lVar7] != local_158[lVar7]) goto LAB_0013ee43;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x40);
    iVar5 = 0;
LAB_0013ee43:
    if (iVar5 != 0) goto LAB_0014016c;
    local_218[8] = auStack_160[0];
    local_218[9] = auStack_160[1];
    local_218[10] = auStack_160[2];
    local_218[0xb] = auStack_160[3];
    local_218[0xc] = auStack_160[4];
    local_218[0xd] = auStack_160[5];
    local_218[0xe] = auStack_160[6];
    local_218[0xf] = auStack_160[7];
    local_218[0] = local_178[0x10];
    local_218[1] = local_178[0x11];
    local_218[2] = local_178[0x12];
    local_218[3] = local_178[0x13];
    local_218[4] = local_178[0x14];
    local_218[5] = local_178[0x15];
    local_218[6] = local_178[0x16];
    local_218[7] = local_178[0x17];
    local_228[8] = local_178[8];
    local_228[9] = local_178[9];
    local_228[10] = local_178[10];
    local_228[0xb] = local_178[0xb];
    local_228[0xc] = local_178[0xc];
    local_228[0xd] = local_178[0xd];
    local_228[0xe] = local_178[0xe];
    local_228[0xf] = local_178[0xf];
    local_228[0] = local_178[0];
    local_228[1] = local_178[1];
    local_228[2] = local_178[2];
    local_228[3] = local_178[3];
    local_228[4] = local_178[4];
    local_228[5] = local_178[5];
    local_228[6] = local_178[6];
    local_228[7] = local_178[7];
    local_238 = local_188;
    local_248 = local_198;
    local_1f8[0] = local_118[0];
    local_1f8[1] = local_118[1];
    local_1f8[2] = local_118[2];
    local_1f8[3] = local_118[3];
    local_1f8[4] = local_118[4];
    local_1f8[5] = local_118[5];
    local_1f8[6] = local_118[6];
    local_1f8[7] = local_118[7];
    auStack_1f0[0] = auStack_110[0];
    auStack_1f0[1] = auStack_110[1];
    auStack_1f0[2] = auStack_110[2];
    auStack_1f0[3] = auStack_110[3];
    auStack_1f0[4] = auStack_110[4];
    auStack_1f0[5] = auStack_110[5];
    auStack_1f0[6] = auStack_110[6];
    auStack_1f0[7] = auStack_110[7];
    auStack_1f0[8] = auStack_110[8];
    auStack_1f0[9] = auStack_110[9];
    auStack_1f0[10] = auStack_110[10];
    auStack_1f0[0xb] = auStack_110[0xb];
    auStack_1f0[0xc] = auStack_110[0xc];
    auStack_1f0[0xd] = auStack_110[0xd];
    auStack_1f0[0xe] = auStack_110[0xe];
    auStack_1f0[0xf] = auStack_110[0xf];
    uStack_1e0._0_1_ = auStack_110[0x10];
    uStack_1e0._1_1_ = auStack_110[0x11];
    uStack_1e0._2_1_ = auStack_110[0x12];
    uStack_1e0._3_1_ = auStack_110[0x13];
    uStack_1e0._4_1_ = auStack_110[0x14];
    uStack_1e0._5_1_ = auStack_110[0x15];
    uStack_1e0._6_1_ = auStack_110[0x16];
    uStack_1e0._7_1_ = auStack_110[0x17];
    local_1c8 = ZEXT816(0);
    local_1b8._0_15_ = ZEXT815(0);
    local_1b8[0xf] = 1;
    iVar5 = secp256k1_ec_seckey_verify(CTX,local_1c8);
    if (iVar5 == 0) goto LAB_00140171;
    iVar5 = secp256k1_ec_seckey_verify(CTX,local_1f8);
    if (iVar5 != 0) goto LAB_00140176;
    iVar5 = secp256k1_ec_seckey_tweak_add(CTX,local_1f8,local_1c8);
    if (iVar5 != 0) goto LAB_0014017b;
    lVar7 = 0;
    do {
      iVar5 = (uint)(byte)local_158[lVar7] - (uint)local_1f8[lVar7];
      if (local_158[lVar7] != local_1f8[lVar7]) goto LAB_0013ef25;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x20);
    iVar5 = 0;
LAB_0013ef25:
    if (iVar5 != 0) goto LAB_00140180;
    auStack_1f0[8] = auStack_110[8];
    auStack_1f0[9] = auStack_110[9];
    auStack_1f0[10] = auStack_110[10];
    auStack_1f0[0xb] = auStack_110[0xb];
    auStack_1f0[0xc] = auStack_110[0xc];
    auStack_1f0[0xd] = auStack_110[0xd];
    auStack_1f0[0xe] = auStack_110[0xe];
    auStack_1f0[0xf] = auStack_110[0xf];
    uStack_1e0._0_1_ = auStack_110[0x10];
    uStack_1e0._1_1_ = auStack_110[0x11];
    uStack_1e0._2_1_ = auStack_110[0x12];
    uStack_1e0._3_1_ = auStack_110[0x13];
    uStack_1e0._4_1_ = auStack_110[0x14];
    uStack_1e0._5_1_ = auStack_110[0x15];
    uStack_1e0._6_1_ = auStack_110[0x16];
    uStack_1e0._7_1_ = auStack_110[0x17];
    local_1f8[0] = local_118[0];
    local_1f8[1] = local_118[1];
    local_1f8[2] = local_118[2];
    local_1f8[3] = local_118[3];
    local_1f8[4] = local_118[4];
    local_1f8[5] = local_118[5];
    local_1f8[6] = local_118[6];
    local_1f8[7] = local_118[7];
    auStack_1f0[0] = auStack_110[0];
    auStack_1f0[1] = auStack_110[1];
    auStack_1f0[2] = auStack_110[2];
    auStack_1f0[3] = auStack_110[3];
    auStack_1f0[4] = auStack_110[4];
    auStack_1f0[5] = auStack_110[5];
    auStack_1f0[6] = auStack_110[6];
    auStack_1f0[7] = auStack_110[7];
    iVar5 = secp256k1_ec_seckey_tweak_mul(CTX,local_1f8,local_1c8);
    if (iVar5 != 0) goto LAB_00140185;
    lVar7 = 0;
    do {
      iVar5 = (uint)(byte)local_158[lVar7] - (uint)local_1f8[lVar7];
      if (local_158[lVar7] != local_1f8[lVar7]) goto LAB_0013ef8d;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x20);
    iVar5 = 0;
LAB_0013ef8d:
    if (iVar5 != 0) goto LAB_0014018a;
    auStack_1f0[8] = auStack_110[8];
    auStack_1f0[9] = auStack_110[9];
    auStack_1f0[10] = auStack_110[10];
    auStack_1f0[0xb] = auStack_110[0xb];
    auStack_1f0[0xc] = auStack_110[0xc];
    auStack_1f0[0xd] = auStack_110[0xd];
    auStack_1f0[0xe] = auStack_110[0xe];
    auStack_1f0[0xf] = auStack_110[0xf];
    local_1f8[0] = local_118[0];
    local_1f8[1] = local_118[1];
    local_1f8[2] = local_118[2];
    local_1f8[3] = local_118[3];
    local_1f8[4] = local_118[4];
    local_1f8[5] = local_118[5];
    local_1f8[6] = local_118[6];
    local_1f8[7] = local_118[7];
    auStack_1f0[0] = auStack_110[0];
    auStack_1f0[1] = auStack_110[1];
    auStack_1f0[2] = auStack_110[2];
    auStack_1f0[3] = auStack_110[3];
    auStack_1f0[4] = auStack_110[4];
    auStack_1f0[5] = auStack_110[5];
    auStack_1f0[6] = auStack_110[6];
    auStack_1f0[7] = auStack_110[7];
    uStack_1e0._0_7_ = (undefined7)auStack_110._16_8_;
    uStack_1e0._7_1_ = '@';
    iVar5 = secp256k1_ec_seckey_tweak_add(CTX,local_1f8,local_118);
    if (iVar5 != 0) goto LAB_0014018f;
    lVar7 = 0;
    do {
      iVar5 = (uint)(byte)local_158[lVar7] - (uint)local_1f8[lVar7];
      if (local_158[lVar7] != local_1f8[lVar7]) goto LAB_0013eff0;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x20);
    iVar5 = 0;
LAB_0013eff0:
    if (iVar5 != 0) goto LAB_00140194;
    auStack_1f0[8] = auStack_110[8];
    auStack_1f0[9] = auStack_110[9];
    auStack_1f0[10] = auStack_110[10];
    auStack_1f0[0xb] = auStack_110[0xb];
    auStack_1f0[0xc] = auStack_110[0xc];
    auStack_1f0[0xd] = auStack_110[0xd];
    auStack_1f0[0xe] = auStack_110[0xe];
    auStack_1f0[0xf] = auStack_110[0xf];
    local_1f8[0] = local_118[0];
    local_1f8[1] = local_118[1];
    local_1f8[2] = local_118[2];
    local_1f8[3] = local_118[3];
    local_1f8[4] = local_118[4];
    local_1f8[5] = local_118[5];
    local_1f8[6] = local_118[6];
    local_1f8[7] = local_118[7];
    auStack_1f0[0] = auStack_110[0];
    auStack_1f0[1] = auStack_110[1];
    auStack_1f0[2] = auStack_110[2];
    auStack_1f0[3] = auStack_110[3];
    auStack_1f0[4] = auStack_110[4];
    auStack_1f0[5] = auStack_110[5];
    auStack_1f0[6] = auStack_110[6];
    auStack_1f0[7] = auStack_110[7];
    uStack_1e0._0_7_ = (undefined7)auStack_110._16_8_;
    uStack_1e0._7_1_ = '@';
    iVar5 = secp256k1_ec_seckey_tweak_mul(CTX,local_1f8,local_118);
    if (iVar5 != 0) goto LAB_00140199;
    lVar7 = 0;
    do {
      iVar5 = (uint)(byte)local_158[lVar7] - (uint)local_1f8[lVar7];
      if (local_158[lVar7] != local_1f8[lVar7]) goto LAB_0013f053;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x20);
    iVar5 = 0;
LAB_0013f053:
    if (iVar5 != 0) goto LAB_0014019e;
    auStack_1f0[8] = auStack_110[8];
    auStack_1f0[9] = auStack_110[9];
    auStack_1f0[10] = auStack_110[10];
    auStack_1f0[0xb] = auStack_110[0xb];
    auStack_1f0[0xc] = auStack_110[0xc];
    auStack_1f0[0xd] = auStack_110[0xd];
    auStack_1f0[0xe] = auStack_110[0xe];
    auStack_1f0[0xf] = auStack_110[0xf];
    local_1f8[0] = local_118[0];
    local_1f8[1] = local_118[1];
    local_1f8[2] = local_118[2];
    local_1f8[3] = local_118[3];
    local_1f8[4] = local_118[4];
    local_1f8[5] = local_118[5];
    local_1f8[6] = local_118[6];
    local_1f8[7] = local_118[7];
    auStack_1f0[0] = auStack_110[0];
    auStack_1f0[1] = auStack_110[1];
    auStack_1f0[2] = auStack_110[2];
    auStack_1f0[3] = auStack_110[3];
    auStack_1f0[4] = auStack_110[4];
    auStack_1f0[5] = auStack_110[5];
    auStack_1f0[6] = auStack_110[6];
    auStack_1f0[7] = auStack_110[7];
    uStack_1e0._0_7_ = (undefined7)auStack_110._16_8_;
    uStack_1e0._7_1_ = '@';
    iVar5 = secp256k1_ec_pubkey_tweak_add(CTX,(secp256k1_pubkey *)local_248,local_118);
    if (iVar5 != 0) goto LAB_001401a3;
    lVar7 = 0;
    do {
      iVar5 = (uint)(byte)local_248[lVar7] - (uint)(byte)local_158[lVar7];
      if (local_248[lVar7] != local_158[lVar7]) goto LAB_0013f0ba;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x40);
    iVar5 = 0;
LAB_0013f0ba:
    if (iVar5 != 0) goto LAB_001401a8;
    local_218[8] = auStack_160[0];
    local_218[9] = auStack_160[1];
    local_218[10] = auStack_160[2];
    local_218[0xb] = auStack_160[3];
    local_218[0xc] = auStack_160[4];
    local_218[0xd] = auStack_160[5];
    local_218[0xe] = auStack_160[6];
    local_218[0xf] = auStack_160[7];
    local_218[0] = local_178[0x10];
    local_218[1] = local_178[0x11];
    local_218[2] = local_178[0x12];
    local_218[3] = local_178[0x13];
    local_218[4] = local_178[0x14];
    local_218[5] = local_178[0x15];
    local_218[6] = local_178[0x16];
    local_218[7] = local_178[0x17];
    local_228[8] = local_178[8];
    local_228[9] = local_178[9];
    local_228[10] = local_178[10];
    local_228[0xb] = local_178[0xb];
    local_228[0xc] = local_178[0xc];
    local_228[0xd] = local_178[0xd];
    local_228[0xe] = local_178[0xe];
    local_228[0xf] = local_178[0xf];
    local_228[0] = local_178[0];
    local_228[1] = local_178[1];
    local_228[2] = local_178[2];
    local_228[3] = local_178[3];
    local_228[4] = local_178[4];
    local_228[5] = local_178[5];
    local_228[6] = local_178[6];
    local_228[7] = local_178[7];
    local_238 = local_188;
    local_248 = local_198;
    iVar5 = secp256k1_ec_pubkey_tweak_mul(CTX,(secp256k1_pubkey *)local_248,local_118);
    if (iVar5 != 0) goto LAB_001401ad;
    lVar7 = 0;
    do {
      iVar5 = (uint)(byte)local_248[lVar7] - (uint)(byte)local_158[lVar7];
      if (local_248[lVar7] != local_158[lVar7]) goto LAB_0013f13a;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x40);
    iVar5 = 0;
LAB_0013f13a:
    if (iVar5 != 0) goto LAB_001401b2;
    local_218[8] = auStack_160[0];
    local_218[9] = auStack_160[1];
    local_218[10] = auStack_160[2];
    local_218[0xb] = auStack_160[3];
    local_218[0xc] = auStack_160[4];
    local_218[0xd] = auStack_160[5];
    local_218[0xe] = auStack_160[6];
    local_218[0xf] = auStack_160[7];
    local_218[0] = local_178[0x10];
    local_218[1] = local_178[0x11];
    local_218[2] = local_178[0x12];
    local_218[3] = local_178[0x13];
    local_218[4] = local_178[0x14];
    local_218[5] = local_178[0x15];
    local_218[6] = local_178[0x16];
    local_218[7] = local_178[0x17];
    local_228[8] = local_178[8];
    local_228[9] = local_178[9];
    local_228[10] = local_178[10];
    local_228[0xb] = local_178[0xb];
    local_228[0xc] = local_178[0xc];
    local_228[0xd] = local_178[0xd];
    local_228[0xe] = local_178[0xe];
    local_228[0xf] = local_178[0xf];
    local_228[0] = local_178[0];
    local_228[1] = local_178[1];
    local_228[2] = local_178[2];
    local_228[3] = local_178[3];
    local_228[4] = local_178[4];
    local_228[5] = local_178[5];
    local_228[6] = local_178[6];
    local_228[7] = local_178[7];
    local_238 = local_188;
    local_248 = local_198;
    auStack_1f0[8] = auStack_110[8];
    auStack_1f0[9] = auStack_110[9];
    auStack_1f0[10] = auStack_110[10];
    auStack_1f0[0xb] = auStack_110[0xb];
    auStack_1f0[0xc] = auStack_110[0xc];
    auStack_1f0[0xd] = auStack_110[0xd];
    auStack_1f0[0xe] = auStack_110[0xe];
    auStack_1f0[0xf] = auStack_110[0xf];
    local_1f8[0] = local_118[0];
    local_1f8[1] = local_118[1];
    local_1f8[2] = local_118[2];
    local_1f8[3] = local_118[3];
    local_1f8[4] = local_118[4];
    local_1f8[5] = local_118[5];
    local_1f8[6] = local_118[6];
    local_1f8[7] = local_118[7];
    auStack_1f0[0] = auStack_110[0];
    auStack_1f0[1] = auStack_110[1];
    auStack_1f0[2] = auStack_110[2];
    auStack_1f0[3] = auStack_110[3];
    auStack_1f0[4] = auStack_110[4];
    auStack_1f0[5] = auStack_110[5];
    auStack_1f0[6] = auStack_110[6];
    auStack_1f0[7] = auStack_110[7];
    uStack_1e0._0_7_ = (undefined7)auStack_110._16_8_;
    uStack_1e0._7_1_ = '@';
    local_1c8 = ZEXT816(0);
    local_1b8._0_15_ = ZEXT815(0);
    local_1b8[0xf] = 1;
    iVar5 = secp256k1_ec_seckey_tweak_add(CTX,local_1c8,local_1f8);
    if (iVar5 != 0) goto LAB_001401b7;
    lVar7 = 0;
    do {
      iVar5 = (uint)(byte)local_158[lVar7] - (uint)(byte)local_1c8[lVar7];
      if (local_158[lVar7] != local_1c8[lVar7]) goto LAB_0013f1eb;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x20);
    iVar5 = 0;
LAB_0013f1eb:
    if (iVar5 != 0) goto LAB_001401bc;
    local_1b8[0xf] = 1;
    iVar5 = secp256k1_ec_pubkey_tweak_add(CTX,(secp256k1_pubkey *)local_248,local_1c8);
    if (iVar5 != 0) goto LAB_001401c1;
    lVar7 = 0;
    do {
      iVar5 = (uint)(byte)local_248[lVar7] - (uint)(byte)local_158[lVar7];
      if (local_248[lVar7] != local_158[lVar7]) goto LAB_0013f240;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x40);
    iVar5 = 0;
LAB_0013f240:
    if (iVar5 != 0) goto LAB_001401c6;
    local_218[8] = auStack_160[0];
    local_218[9] = auStack_160[1];
    local_218[10] = auStack_160[2];
    local_218[0xb] = auStack_160[3];
    local_218[0xc] = auStack_160[4];
    local_218[0xd] = auStack_160[5];
    local_218[0xe] = auStack_160[6];
    local_218[0xf] = auStack_160[7];
    local_218[0] = local_178[0x10];
    local_218[1] = local_178[0x11];
    local_218[2] = local_178[0x12];
    local_218[3] = local_178[0x13];
    local_218[4] = local_178[0x14];
    local_218[5] = local_178[0x15];
    local_218[6] = local_178[0x16];
    local_218[7] = local_178[0x17];
    local_228[8] = local_178[8];
    local_228[9] = local_178[9];
    local_228[10] = local_178[10];
    local_228[0xb] = local_178[0xb];
    local_228[0xc] = local_178[0xc];
    local_228[0xd] = local_178[0xd];
    local_228[0xe] = local_178[0xe];
    local_228[0xf] = local_178[0xf];
    local_228[0] = local_178[0];
    local_228[1] = local_178[1];
    local_228[2] = local_178[2];
    local_228[3] = local_178[3];
    local_228[4] = local_178[4];
    local_228[5] = local_178[5];
    local_228[6] = local_178[6];
    local_228[7] = local_178[7];
    local_238 = local_188;
    local_248 = local_198;
    local_1b8[0xf] = 2;
    iVar5 = secp256k1_ec_seckey_tweak_add(CTX,local_1c8,local_1f8);
    if (iVar5 == 0) goto LAB_001401cb;
    lVar7 = 0;
    do {
      iVar5 = (uint)(byte)local_1c8[lVar7] - (uint)(byte)local_158[lVar7];
      if (local_1c8[lVar7] != local_158[lVar7]) goto LAB_0013f2cc;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x1f);
    iVar5 = 0;
LAB_0013f2cc:
    if ((iVar5 != 0) || (local_1b8[0xf] != '\x01')) goto LAB_001401d0;
    local_1b8[0xf] = 2;
    iVar5 = secp256k1_ec_pubkey_tweak_add(CTX,(secp256k1_pubkey *)local_248,local_1c8);
    if (iVar5 == 0) goto LAB_001401d5;
    local_1b8[0xf] = 1;
    iVar5 = secp256k1_ec_pubkey_create(CTX,(secp256k1_pubkey *)local_198,local_1c8);
    if (iVar5 == 0) goto LAB_001401da;
    lVar7 = 0;
    do {
      iVar5 = (uint)(byte)local_248[lVar7] - (uint)(byte)local_198[lVar7];
      if (local_248[lVar7] != local_198[lVar7]) goto LAB_0013f357;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x40);
    iVar5 = 0;
LAB_0013f357:
    if (iVar5 != 0) goto LAB_001401df;
    iVar5 = secp256k1_ec_pubkey_tweak_add(CTX,(secp256k1_pubkey *)local_248,local_1c8);
    if (iVar5 == 0) goto LAB_001401e4;
    local_1b8[0xf] = 2;
    iVar5 = secp256k1_ec_pubkey_tweak_mul(CTX,(secp256k1_pubkey *)local_198,local_1c8);
    psVar6 = CTX;
    if (iVar5 == 0) goto LAB_001401e9;
    lVar7 = 0;
    do {
      iVar5 = (uint)(byte)local_248[lVar7] - (uint)(byte)local_198[lVar7];
      if (local_248[lVar7] != local_198[lVar7]) goto LAB_0013f3d0;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x40);
    iVar5 = 0;
LAB_0013f3d0:
    if (iVar5 != 0) goto LAB_001401ee;
    local_254 = 0;
    if (secp256k1_context_static == CTX) goto LAB_001401f3;
    (CTX->illegal_callback).fn = counting_illegal_callback_fn;
    (psVar6->illegal_callback).data = &local_254;
  }
  else {
    run_eckey_edge_case_test_cold_1();
LAB_001400f4:
    run_eckey_edge_case_test_cold_2();
LAB_001400f9:
    run_eckey_edge_case_test_cold_3();
LAB_001400fe:
    run_eckey_edge_case_test_cold_4();
LAB_00140103:
    run_eckey_edge_case_test_cold_5();
LAB_00140108:
    run_eckey_edge_case_test_cold_6();
LAB_0014010d:
    run_eckey_edge_case_test_cold_7();
LAB_00140112:
    run_eckey_edge_case_test_cold_8();
LAB_00140117:
    run_eckey_edge_case_test_cold_9();
LAB_0014011c:
    run_eckey_edge_case_test_cold_97();
LAB_00140121:
    run_eckey_edge_case_test_cold_96();
LAB_00140126:
    run_eckey_edge_case_test_cold_95();
LAB_0014012b:
    run_eckey_edge_case_test_cold_10();
LAB_00140130:
    run_eckey_edge_case_test_cold_11();
LAB_00140135:
    run_eckey_edge_case_test_cold_12();
LAB_0014013a:
    run_eckey_edge_case_test_cold_94();
LAB_0014013f:
    run_eckey_edge_case_test_cold_93();
LAB_00140144:
    run_eckey_edge_case_test_cold_92();
LAB_00140149:
    run_eckey_edge_case_test_cold_91();
LAB_0014014e:
    run_eckey_edge_case_test_cold_90();
LAB_00140153:
    run_eckey_edge_case_test_cold_89();
LAB_00140158:
    run_eckey_edge_case_test_cold_13();
LAB_0014015d:
    run_eckey_edge_case_test_cold_14();
LAB_00140162:
    run_eckey_edge_case_test_cold_15();
LAB_00140167:
    run_eckey_edge_case_test_cold_16();
LAB_0014016c:
    run_eckey_edge_case_test_cold_17();
LAB_00140171:
    run_eckey_edge_case_test_cold_88();
LAB_00140176:
    run_eckey_edge_case_test_cold_18();
LAB_0014017b:
    run_eckey_edge_case_test_cold_19();
LAB_00140180:
    run_eckey_edge_case_test_cold_20();
LAB_00140185:
    run_eckey_edge_case_test_cold_21();
LAB_0014018a:
    run_eckey_edge_case_test_cold_22();
LAB_0014018f:
    run_eckey_edge_case_test_cold_23();
LAB_00140194:
    run_eckey_edge_case_test_cold_24();
LAB_00140199:
    run_eckey_edge_case_test_cold_25();
LAB_0014019e:
    run_eckey_edge_case_test_cold_26();
LAB_001401a3:
    run_eckey_edge_case_test_cold_27();
LAB_001401a8:
    run_eckey_edge_case_test_cold_28();
LAB_001401ad:
    run_eckey_edge_case_test_cold_29();
LAB_001401b2:
    run_eckey_edge_case_test_cold_30();
LAB_001401b7:
    run_eckey_edge_case_test_cold_31();
LAB_001401bc:
    run_eckey_edge_case_test_cold_32();
LAB_001401c1:
    run_eckey_edge_case_test_cold_33();
LAB_001401c6:
    run_eckey_edge_case_test_cold_34();
LAB_001401cb:
    run_eckey_edge_case_test_cold_87();
LAB_001401d0:
    run_eckey_edge_case_test_cold_86();
LAB_001401d5:
    run_eckey_edge_case_test_cold_85();
LAB_001401da:
    run_eckey_edge_case_test_cold_84();
LAB_001401df:
    run_eckey_edge_case_test_cold_35();
LAB_001401e4:
    run_eckey_edge_case_test_cold_83();
LAB_001401e9:
    run_eckey_edge_case_test_cold_82();
LAB_001401ee:
    run_eckey_edge_case_test_cold_36();
    psVar6 = extraout_RAX;
LAB_001401f3:
    (*(psVar6->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar6->illegal_callback).data);
  }
  if (local_254 == 0) {
    local_238 = ZEXT816(0);
    local_248 = ZEXT816(0);
    iVar5 = secp256k1_ec_pubkey_tweak_add(CTX,(secp256k1_pubkey *)local_248,local_1c8);
    if (iVar5 != 0) goto LAB_00140211;
    if (local_254 != 1) goto LAB_00140216;
    lVar7 = 0;
    do {
      iVar5 = (uint)(byte)local_248[lVar7] - (uint)(byte)local_158[lVar7];
      if (local_248[lVar7] != local_158[lVar7]) goto LAB_0013f47a;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x40);
    iVar5 = 0;
LAB_0013f47a:
    if (iVar5 != 0) goto LAB_0014021b;
    local_218[8] = auStack_160[0];
    local_218[9] = auStack_160[1];
    local_218[10] = auStack_160[2];
    local_218[0xb] = auStack_160[3];
    local_218[0xc] = auStack_160[4];
    local_218[0xd] = auStack_160[5];
    local_218[0xe] = auStack_160[6];
    local_218[0xf] = auStack_160[7];
    local_218[0] = local_178[0x10];
    local_218[1] = local_178[0x11];
    local_218[2] = local_178[0x12];
    local_218[3] = local_178[0x13];
    local_218[4] = local_178[0x14];
    local_218[5] = local_178[0x15];
    local_218[6] = local_178[0x16];
    local_218[7] = local_178[0x17];
    local_228[8] = local_178[8];
    local_228[9] = local_178[9];
    local_228[10] = local_178[10];
    local_228[0xb] = local_178[0xb];
    local_228[0xc] = local_178[0xc];
    local_228[0xd] = local_178[0xd];
    local_228[0xe] = local_178[0xe];
    local_228[0xf] = local_178[0xf];
    local_228[0] = local_178[0];
    local_228[1] = local_178[1];
    local_228[2] = local_178[2];
    local_228[3] = local_178[3];
    local_228[4] = local_178[4];
    local_228[5] = local_178[5];
    local_228[6] = local_178[6];
    local_228[7] = local_178[7];
    local_238 = local_188;
    local_248 = local_198;
    local_198 = (undefined1  [16])0x0;
    local_188 = (undefined1  [16])0x0;
    iVar5 = secp256k1_ec_pubkey_tweak_mul(CTX,(secp256k1_pubkey *)local_198,local_1c8);
    if (iVar5 != 0) goto LAB_00140220;
    if (local_254 != 2) goto LAB_00140225;
    lVar7 = 0;
    do {
      iVar5 = (uint)(byte)local_198[lVar7] - (uint)(byte)local_158[lVar7];
      if (local_198[lVar7] != local_158[lVar7]) goto LAB_0013f50e;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x40);
    iVar5 = 0;
LAB_0013f50e:
    if (iVar5 != 0) goto LAB_0014022a;
    local_254 = 0;
    iVar5 = secp256k1_ec_seckey_verify(CTX,local_1f8);
    if (iVar5 == 0) goto LAB_0014022f;
    if (local_254 != 0) goto LAB_00140234;
    (*(CTX->illegal_callback).fn)("seckey != NULL",(CTX->illegal_callback).data);
    if (local_254 != 1) goto LAB_00140239;
    local_254 = 0;
    local_1c8 = (undefined1  [16])0x0;
    local_1b8._0_15_ = SUB1615((undefined1  [16])0x0,0);
    local_1b8[0xf] = 4;
    (*(CTX->illegal_callback).fn)("pubkey != NULL",(CTX->illegal_callback).data);
    if (local_254 != 1) goto LAB_0014023e;
    (*(CTX->illegal_callback).fn)("tweak32 != NULL",(CTX->illegal_callback).data);
    if (local_254 != 2) goto LAB_00140243;
    local_254 = 0;
    local_1c8 = (undefined1  [16])0x0;
    local_1b8._0_15_ = SUB1615((undefined1  [16])0x0,0);
    local_1b8[0xf] = 4;
    (*(CTX->illegal_callback).fn)("pubkey != NULL",(CTX->illegal_callback).data);
    if (local_254 != 1) goto LAB_00140248;
    (*(CTX->illegal_callback).fn)("tweak32 != NULL",(CTX->illegal_callback).data);
    if (local_254 != 2) goto LAB_0014024d;
    local_254 = 0;
    local_1c8 = (undefined1  [16])0x0;
    local_1b8 = (undefined1  [16])0x0;
    (*(CTX->illegal_callback).fn)("seckey != NULL",(CTX->illegal_callback).data);
    if (local_254 != 1) goto LAB_00140252;
    (*(CTX->illegal_callback).fn)("tweak32 != NULL",(CTX->illegal_callback).data);
    if (local_254 != 2) goto LAB_00140257;
    local_254 = 0;
    local_1c8 = (undefined1  [16])0x0;
    local_1b8._0_15_ = SUB1615((undefined1  [16])0x0,0);
    local_1b8[0xf] = 1;
    pcVar8 = "seckey != NULL";
    (*(CTX->illegal_callback).fn)("seckey != NULL",(CTX->illegal_callback).data);
    if (local_254 != 1) goto LAB_0014025c;
    (*(CTX->illegal_callback).fn)("tweak32 != NULL",(CTX->illegal_callback).data);
    if (local_254 != 2) goto LAB_00140261;
    local_254 = 0;
    (*(CTX->illegal_callback).fn)("pubkey != NULL",(CTX->illegal_callback).data);
    if (local_254 != 1) goto LAB_00140266;
    local_248 = (undefined1  [16])0x0;
    local_238 = (undefined1  [16])0x0;
    local_228 = (undefined1  [16])0x0;
    local_218 = (undefined1  [16])0x0;
    if ((CTX->ecmult_gen_ctx).built == 0) {
      pcVar8 = "secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx)";
    }
    (*(CTX->illegal_callback).fn)(pcVar8,(CTX->illegal_callback).data);
    if (local_254 != 2) goto LAB_0014026b;
    lVar7 = 0;
    do {
      iVar5 = (uint)(byte)local_248[lVar7] - (uint)(byte)local_158[lVar7];
      if (local_248[lVar7] != local_158[lVar7]) goto LAB_0013f7cd;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x40);
    iVar5 = 0;
LAB_0013f7cd:
    if (iVar5 != 0) goto LAB_00140270;
    local_254 = 0;
    lVar7 = 0;
    local_b8 = 0x4d430001;
    local_a8 = 0x40;
    local_a0 = 0;
    local_98 = 0;
    local_90 = 0;
    local_250 = 0;
    local_248 = (undefined1  [16])0x0;
    local_238 = (undefined1  [16])0x0;
    local_228 = (undefined1  [16])0x0;
    local_218 = (undefined1  [16])0x0;
    local_b0 = (secp256k1_pubkey *)local_248;
    local_88 = &local_f8;
    (*(CTX->illegal_callback).fn)("n >= 1",(CTX->illegal_callback).data);
    local_b8 = 0x4d430005;
    local_a8 = 0x40;
    local_a0 = 0;
    local_98 = 0;
    local_90 = 0;
    local_250 = 0;
    do {
      iVar5 = (uint)(byte)local_248[lVar7] - (uint)(byte)local_158[lVar7];
      if (local_248[lVar7] != local_158[lVar7]) goto LAB_0013f9b6;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x40);
    iVar5 = 0;
LAB_0013f9b6:
    local_b0 = (secp256k1_pubkey *)local_248;
    if (iVar5 != 0) goto LAB_00140275;
    if (local_254 != 1) goto LAB_0014027a;
    (*(CTX->illegal_callback).fn)("pubnonce != NULL",(CTX->illegal_callback).data);
    lVar7 = 0;
    do {
      iVar5 = (uint)(byte)local_248[lVar7] - (uint)(byte)local_158[lVar7];
      if (local_248[lVar7] != local_158[lVar7]) goto LAB_0013fa0c;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x40);
    iVar5 = 0;
LAB_0013fa0c:
    if (iVar5 != 0) goto LAB_0014027f;
    if (local_254 != 2) goto LAB_00140284;
    local_b8 = 0x4d430001;
    local_a8 = 0x40;
    lVar7 = 0;
    local_a0 = 0;
    local_98 = 0;
    local_90 = 0;
    local_250 = 0;
    local_248 = (undefined1  [16])0x0;
    local_238 = (undefined1  [16])0x0;
    local_228 = (undefined1  [16])0x0;
    local_218 = (undefined1  [16])0x0;
    local_b0 = (secp256k1_pubkey *)local_248;
    (*(CTX->illegal_callback).fn)("pubnonces != NULL",(CTX->illegal_callback).data);
    local_b8 = 0x4d430005;
    local_a8 = 0x40;
    local_a0 = 0;
    local_98 = 0;
    local_90 = 0;
    local_250 = 0;
    do {
      iVar5 = (uint)(byte)local_248[lVar7] - (uint)(byte)local_158[lVar7];
      if (local_248[lVar7] != local_158[lVar7]) goto LAB_0013fb2a;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x40);
    iVar5 = 0;
LAB_0013fb2a:
    local_b0 = (secp256k1_pubkey *)local_248;
    if (iVar5 != 0) goto LAB_00140289;
    if (local_254 != 3) goto LAB_0014028e;
    local_88 = &local_68;
    local_248._8_4_ = 0xffffffff;
    local_248._0_8_ = 0xffffffffffffffff;
    local_248._12_4_ = 0xffffffff;
    local_238._8_4_ = 0xffffffff;
    local_238._0_8_ = 0xffffffffffffffff;
    local_238._12_4_ = 0xffffffff;
    local_228._8_4_ = 0xffffffff;
    local_228._0_8_ = 0xffffffffffffffff;
    local_228._12_4_ = 0xffffffff;
    local_218._8_4_ = 0xffffffff;
    local_218._0_8_ = 0xffffffffffffffff;
    local_218._12_4_ = 0xffffffff;
    local_b8 = 0x4d430001;
    local_a8 = 0x40;
    local_a0 = 0;
    local_98 = 0;
    local_90 = 0;
    local_250 = 0;
    iVar5 = secp256k1_ec_pubkey_combine(CTX,(secp256k1_pubkey *)local_248,&local_88,1);
    if (iVar5 == 0) goto LAB_00140293;
    local_b8 = 0x4d430005;
    local_a8 = 0x40;
    lVar7 = 0;
    local_a0 = 0;
    local_98 = 0;
    local_90 = 0;
    local_250 = 0;
    do {
      iVar5 = (uint)(byte)local_248[lVar7] - (uint)(byte)local_158[lVar7];
      if (local_248[lVar7] != local_158[lVar7]) goto LAB_0013fc41;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x40);
    iVar5 = 0;
LAB_0013fc41:
    local_b0 = (secp256k1_pubkey *)local_248;
    if (iVar5 < 1) goto LAB_00140298;
    if (local_254 != 3) goto LAB_0014029d;
    local_250 = 0x21;
    iVar5 = secp256k1_ec_pubkey_serialize
                      (CTX,local_1f8,&local_250,(secp256k1_pubkey *)local_248,0x102);
    if (iVar5 == 0) goto LAB_001402a2;
    iVar5 = secp256k1_ec_pubkey_serialize(CTX,local_1c8,&local_250,&local_68,0x102);
    if (iVar5 == 0) goto LAB_001402a7;
    lVar7 = 0;
    do {
      iVar5 = (uint)local_1f8[lVar7] - (uint)(byte)local_1c8[lVar7];
      if (local_1f8[lVar7] != local_1c8[lVar7]) goto LAB_0013fce1;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x21);
    iVar5 = 0;
LAB_0013fce1:
    if (iVar5 != 0) goto LAB_001402ac;
    local_248._8_4_ = 0xffffffff;
    local_248._0_8_ = 0xffffffffffffffff;
    local_248._12_4_ = 0xffffffff;
    local_238._8_4_ = 0xffffffff;
    local_238._0_8_ = 0xffffffffffffffff;
    local_238._12_4_ = 0xffffffff;
    local_228._8_4_ = 0xffffffff;
    local_228._0_8_ = 0xffffffffffffffff;
    local_228._12_4_ = 0xffffffff;
    local_218._8_4_ = 0xffffffff;
    local_218._0_8_ = 0xffffffffffffffff;
    local_218._12_4_ = 0xffffffff;
    local_b8 = 0x4d430001;
    local_a8 = 0x40;
    local_a0 = 0;
    local_98 = 0;
    local_90 = 0;
    local_200 = 0;
    local_b0 = (secp256k1_pubkey *)local_248;
    local_88 = &local_f8;
    local_80 = &local_68;
    iVar5 = secp256k1_ec_pubkey_combine(CTX,(secp256k1_pubkey *)local_248,&local_88,2);
    if (iVar5 != 0) goto LAB_001402b1;
    local_b8 = 0x4d430005;
    local_a8 = 0x40;
    lVar7 = 0;
    local_a0 = 0;
    local_98 = 0;
    local_90 = 0;
    local_200 = 0;
    do {
      iVar5 = (uint)(byte)local_248[lVar7] - (uint)(byte)local_158[lVar7];
      if (local_248[lVar7] != local_158[lVar7]) goto LAB_0013fde9;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x40);
    iVar5 = 0;
LAB_0013fde9:
    local_b0 = (secp256k1_pubkey *)local_248;
    if (iVar5 != 0) goto LAB_001402b6;
    if (local_254 != 3) goto LAB_001402bb;
    local_248._8_4_ = 0xffffffff;
    local_248._0_8_ = 0xffffffffffffffff;
    local_248._12_4_ = 0xffffffff;
    local_238._8_4_ = 0xffffffff;
    local_238._0_8_ = 0xffffffffffffffff;
    local_238._12_4_ = 0xffffffff;
    local_228._8_4_ = 0xffffffff;
    local_228._0_8_ = 0xffffffffffffffff;
    local_228._12_4_ = 0xffffffff;
    local_218._8_4_ = 0xffffffff;
    local_218._0_8_ = 0xffffffffffffffff;
    local_218._12_4_ = 0xffffffff;
    local_b8 = 0x4d430001;
    local_a8 = 0x40;
    local_a0 = 0;
    local_98 = 0;
    local_90 = 0;
    local_200 = 0;
    local_78 = &local_f8;
    iVar5 = secp256k1_ec_pubkey_combine(CTX,(secp256k1_pubkey *)local_248,&local_88,3);
    if (iVar5 == 0) goto LAB_001402c0;
    local_b8 = 0x4d430005;
    local_a8 = 0x40;
    lVar7 = 0;
    local_a0 = 0;
    local_98 = 0;
    local_90 = 0;
    local_200 = 0;
    do {
      iVar5 = (uint)(byte)local_248[lVar7] - (uint)(byte)local_158[lVar7];
      if (local_248[lVar7] != local_158[lVar7]) goto LAB_0013fef9;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x40);
    iVar5 = 0;
LAB_0013fef9:
    local_b0 = (secp256k1_pubkey *)local_248;
    if (iVar5 < 1) goto LAB_001402c5;
    if (local_254 != 3) goto LAB_001402ca;
    local_250 = 0x21;
    iVar5 = secp256k1_ec_pubkey_serialize
                      (CTX,local_1f8,&local_250,(secp256k1_pubkey *)local_248,0x102);
    if (iVar5 == 0) goto LAB_001402cf;
    iVar5 = secp256k1_ec_pubkey_serialize(CTX,local_1c8,&local_250,&local_f8,0x102);
    if (iVar5 == 0) goto LAB_001402d4;
    lVar7 = 0;
    do {
      iVar5 = (uint)local_1f8[lVar7] - (uint)(byte)local_1c8[lVar7];
      if (local_1f8[lVar7] != local_1c8[lVar7]) goto LAB_0013ff99;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x21);
    iVar5 = 0;
LAB_0013ff99:
    if (iVar5 != 0) goto LAB_001402d9;
    local_248._8_4_ = 0xffffffff;
    local_248._0_8_ = 0xffffffffffffffff;
    local_248._12_4_ = 0xffffffff;
    local_238._8_4_ = 0xffffffff;
    local_238._0_8_ = 0xffffffffffffffff;
    local_238._12_4_ = 0xffffffff;
    local_228._8_4_ = 0xffffffff;
    local_228._0_8_ = 0xffffffffffffffff;
    local_228._12_4_ = 0xffffffff;
    local_218._8_4_ = 0xffffffff;
    local_218._0_8_ = 0xffffffffffffffff;
    local_218._12_4_ = 0xffffffff;
    local_b8 = 0x4d430001;
    local_a8 = 0x40;
    local_a0 = 0;
    local_98 = 0;
    local_90 = 0;
    local_200 = 0;
    local_b0 = (secp256k1_pubkey *)local_248;
    local_80 = &local_f8;
    iVar5 = secp256k1_ec_pubkey_combine(CTX,(secp256k1_pubkey *)local_248,&local_88,2);
    psVar6 = CTX;
    if (iVar5 == 0) goto LAB_001402de;
    local_b8 = 0x4d430005;
    local_a8 = 0x40;
    lVar7 = 0;
    local_a0 = 0;
    local_98 = 0;
    local_90 = 0;
    local_200 = 0;
    do {
      iVar5 = (uint)(byte)local_248[lVar7] - (uint)(byte)local_158[lVar7];
      if (local_248[lVar7] != local_158[lVar7]) goto LAB_0014009e;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x40);
    iVar5 = 0;
LAB_0014009e:
    local_b0 = (secp256k1_pubkey *)local_248;
    if (iVar5 < 1) goto LAB_001402e3;
    if (local_254 == 3) {
      if (secp256k1_context_static != CTX) {
        (CTX->illegal_callback).fn = secp256k1_default_illegal_callback_fn;
        (psVar6->illegal_callback).data = (void *)0x0;
        return;
      }
      goto LAB_001402ed;
    }
  }
  else {
    run_eckey_edge_case_test_cold_37();
LAB_00140211:
    run_eckey_edge_case_test_cold_38();
LAB_00140216:
    run_eckey_edge_case_test_cold_39();
LAB_0014021b:
    run_eckey_edge_case_test_cold_40();
LAB_00140220:
    run_eckey_edge_case_test_cold_41();
LAB_00140225:
    run_eckey_edge_case_test_cold_42();
LAB_0014022a:
    run_eckey_edge_case_test_cold_43();
LAB_0014022f:
    run_eckey_edge_case_test_cold_81();
LAB_00140234:
    run_eckey_edge_case_test_cold_44();
LAB_00140239:
    run_eckey_edge_case_test_cold_45();
LAB_0014023e:
    run_eckey_edge_case_test_cold_46();
LAB_00140243:
    run_eckey_edge_case_test_cold_47();
LAB_00140248:
    run_eckey_edge_case_test_cold_48();
LAB_0014024d:
    run_eckey_edge_case_test_cold_49();
LAB_00140252:
    run_eckey_edge_case_test_cold_50();
LAB_00140257:
    run_eckey_edge_case_test_cold_51();
LAB_0014025c:
    run_eckey_edge_case_test_cold_52();
LAB_00140261:
    run_eckey_edge_case_test_cold_53();
LAB_00140266:
    run_eckey_edge_case_test_cold_54();
LAB_0014026b:
    run_eckey_edge_case_test_cold_55();
LAB_00140270:
    run_eckey_edge_case_test_cold_56();
LAB_00140275:
    run_eckey_edge_case_test_cold_57();
LAB_0014027a:
    run_eckey_edge_case_test_cold_58();
LAB_0014027f:
    run_eckey_edge_case_test_cold_59();
LAB_00140284:
    run_eckey_edge_case_test_cold_60();
LAB_00140289:
    run_eckey_edge_case_test_cold_61();
LAB_0014028e:
    run_eckey_edge_case_test_cold_62();
LAB_00140293:
    run_eckey_edge_case_test_cold_80();
LAB_00140298:
    run_eckey_edge_case_test_cold_79();
LAB_0014029d:
    run_eckey_edge_case_test_cold_63();
LAB_001402a2:
    run_eckey_edge_case_test_cold_78();
LAB_001402a7:
    run_eckey_edge_case_test_cold_77();
LAB_001402ac:
    run_eckey_edge_case_test_cold_64();
LAB_001402b1:
    run_eckey_edge_case_test_cold_65();
LAB_001402b6:
    run_eckey_edge_case_test_cold_66();
LAB_001402bb:
    run_eckey_edge_case_test_cold_67();
LAB_001402c0:
    run_eckey_edge_case_test_cold_76();
LAB_001402c5:
    run_eckey_edge_case_test_cold_75();
LAB_001402ca:
    run_eckey_edge_case_test_cold_68();
LAB_001402cf:
    run_eckey_edge_case_test_cold_74();
LAB_001402d4:
    run_eckey_edge_case_test_cold_73();
LAB_001402d9:
    run_eckey_edge_case_test_cold_69();
LAB_001402de:
    run_eckey_edge_case_test_cold_72();
LAB_001402e3:
    run_eckey_edge_case_test_cold_71();
  }
  run_eckey_edge_case_test_cold_70();
  psVar6 = extraout_RAX_00;
LAB_001402ed:
  (*(psVar6->illegal_callback).fn)
            ("ctx != secp256k1_context_static",(psVar6->illegal_callback).data);
  return;
}

Assistant:

static void run_eckey_edge_case_test(void) {
    const unsigned char orderc[32] = {
        0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff,
        0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xfe,
        0xba, 0xae, 0xdc, 0xe6, 0xaf, 0x48, 0xa0, 0x3b,
        0xbf, 0xd2, 0x5e, 0x8c, 0xd0, 0x36, 0x41, 0x41
    };
    const unsigned char zeros[sizeof(secp256k1_pubkey)] = {0x00};
    unsigned char ctmp[33];
    unsigned char ctmp2[33];
    secp256k1_pubkey pubkey;
    secp256k1_pubkey pubkey2;
    secp256k1_pubkey pubkey_one;
    secp256k1_pubkey pubkey_negone;
    const secp256k1_pubkey *pubkeys[3];
    size_t len;
    int32_t ecount;
    /* Group order is too large, reject. */
    CHECK(secp256k1_ec_seckey_verify(CTX, orderc) == 0);
    SECP256K1_CHECKMEM_UNDEFINE(&pubkey, sizeof(pubkey));
    CHECK(secp256k1_ec_pubkey_create(CTX, &pubkey, orderc) == 0);
    SECP256K1_CHECKMEM_CHECK(&pubkey, sizeof(pubkey));
    CHECK(secp256k1_memcmp_var(&pubkey, zeros, sizeof(secp256k1_pubkey)) == 0);
    /* Maximum value is too large, reject. */
    memset(ctmp, 255, 32);
    CHECK(secp256k1_ec_seckey_verify(CTX, ctmp) == 0);
    memset(&pubkey, 1, sizeof(pubkey));
    SECP256K1_CHECKMEM_UNDEFINE(&pubkey, sizeof(pubkey));
    CHECK(secp256k1_ec_pubkey_create(CTX, &pubkey, ctmp) == 0);
    SECP256K1_CHECKMEM_CHECK(&pubkey, sizeof(pubkey));
    CHECK(secp256k1_memcmp_var(&pubkey, zeros, sizeof(secp256k1_pubkey)) == 0);
    /* Zero is too small, reject. */
    memset(ctmp, 0, 32);
    CHECK(secp256k1_ec_seckey_verify(CTX, ctmp) == 0);
    memset(&pubkey, 1, sizeof(pubkey));
    SECP256K1_CHECKMEM_UNDEFINE(&pubkey, sizeof(pubkey));
    CHECK(secp256k1_ec_pubkey_create(CTX, &pubkey, ctmp) == 0);
    SECP256K1_CHECKMEM_CHECK(&pubkey, sizeof(pubkey));
    CHECK(secp256k1_memcmp_var(&pubkey, zeros, sizeof(secp256k1_pubkey)) == 0);
    /* One must be accepted. */
    ctmp[31] = 0x01;
    CHECK(secp256k1_ec_seckey_verify(CTX, ctmp) == 1);
    memset(&pubkey, 0, sizeof(pubkey));
    SECP256K1_CHECKMEM_UNDEFINE(&pubkey, sizeof(pubkey));
    CHECK(secp256k1_ec_pubkey_create(CTX, &pubkey, ctmp) == 1);
    SECP256K1_CHECKMEM_CHECK(&pubkey, sizeof(pubkey));
    CHECK(secp256k1_memcmp_var(&pubkey, zeros, sizeof(secp256k1_pubkey)) > 0);
    pubkey_one = pubkey;
    /* Group order + 1 is too large, reject. */
    memcpy(ctmp, orderc, 32);
    ctmp[31] = 0x42;
    CHECK(secp256k1_ec_seckey_verify(CTX, ctmp) == 0);
    memset(&pubkey, 1, sizeof(pubkey));
    SECP256K1_CHECKMEM_UNDEFINE(&pubkey, sizeof(pubkey));
    CHECK(secp256k1_ec_pubkey_create(CTX, &pubkey, ctmp) == 0);
    SECP256K1_CHECKMEM_CHECK(&pubkey, sizeof(pubkey));
    CHECK(secp256k1_memcmp_var(&pubkey, zeros, sizeof(secp256k1_pubkey)) == 0);
    /* -1 must be accepted. */
    ctmp[31] = 0x40;
    CHECK(secp256k1_ec_seckey_verify(CTX, ctmp) == 1);
    memset(&pubkey, 0, sizeof(pubkey));
    SECP256K1_CHECKMEM_UNDEFINE(&pubkey, sizeof(pubkey));
    CHECK(secp256k1_ec_pubkey_create(CTX, &pubkey, ctmp) == 1);
    SECP256K1_CHECKMEM_CHECK(&pubkey, sizeof(pubkey));
    CHECK(secp256k1_memcmp_var(&pubkey, zeros, sizeof(secp256k1_pubkey)) > 0);
    pubkey_negone = pubkey;
    /* Tweak of zero leaves the value unchanged. */
    memset(ctmp2, 0, 32);
    CHECK(secp256k1_ec_seckey_tweak_add(CTX, ctmp, ctmp2) == 1);
    CHECK(secp256k1_memcmp_var(orderc, ctmp, 31) == 0 && ctmp[31] == 0x40);
    memcpy(&pubkey2, &pubkey, sizeof(pubkey));
    CHECK(secp256k1_ec_pubkey_tweak_add(CTX, &pubkey, ctmp2) == 1);
    CHECK(secp256k1_memcmp_var(&pubkey, &pubkey2, sizeof(pubkey)) == 0);
    /* Multiply tweak of zero zeroizes the output. */
    CHECK(secp256k1_ec_seckey_tweak_mul(CTX, ctmp, ctmp2) == 0);
    CHECK(secp256k1_memcmp_var(zeros, ctmp, 32) == 0);
    CHECK(secp256k1_ec_pubkey_tweak_mul(CTX, &pubkey, ctmp2) == 0);
    CHECK(secp256k1_memcmp_var(&pubkey, zeros, sizeof(pubkey)) == 0);
    memcpy(&pubkey, &pubkey2, sizeof(pubkey));
    /* If seckey_tweak_add or seckey_tweak_mul are called with an overflowing
    seckey, the seckey is zeroized. */
    memcpy(ctmp, orderc, 32);
    memset(ctmp2, 0, 32);
    ctmp2[31] = 0x01;
    CHECK(secp256k1_ec_seckey_verify(CTX, ctmp2) == 1);
    CHECK(secp256k1_ec_seckey_verify(CTX, ctmp) == 0);
    CHECK(secp256k1_ec_seckey_tweak_add(CTX, ctmp, ctmp2) == 0);
    CHECK(secp256k1_memcmp_var(zeros, ctmp, 32) == 0);
    memcpy(ctmp, orderc, 32);
    CHECK(secp256k1_ec_seckey_tweak_mul(CTX, ctmp, ctmp2) == 0);
    CHECK(secp256k1_memcmp_var(zeros, ctmp, 32) == 0);
    /* If seckey_tweak_add or seckey_tweak_mul are called with an overflowing
    tweak, the seckey is zeroized. */
    memcpy(ctmp, orderc, 32);
    ctmp[31] = 0x40;
    CHECK(secp256k1_ec_seckey_tweak_add(CTX, ctmp, orderc) == 0);
    CHECK(secp256k1_memcmp_var(zeros, ctmp, 32) == 0);
    memcpy(ctmp, orderc, 32);
    ctmp[31] = 0x40;
    CHECK(secp256k1_ec_seckey_tweak_mul(CTX, ctmp, orderc) == 0);
    CHECK(secp256k1_memcmp_var(zeros, ctmp, 32) == 0);
    memcpy(ctmp, orderc, 32);
    ctmp[31] = 0x40;
    /* If pubkey_tweak_add or pubkey_tweak_mul are called with an overflowing
    tweak, the pubkey is zeroized. */
    CHECK(secp256k1_ec_pubkey_tweak_add(CTX, &pubkey, orderc) == 0);
    CHECK(secp256k1_memcmp_var(&pubkey, zeros, sizeof(pubkey)) == 0);
    memcpy(&pubkey, &pubkey2, sizeof(pubkey));
    CHECK(secp256k1_ec_pubkey_tweak_mul(CTX, &pubkey, orderc) == 0);
    CHECK(secp256k1_memcmp_var(&pubkey, zeros, sizeof(pubkey)) == 0);
    memcpy(&pubkey, &pubkey2, sizeof(pubkey));
    /* If the resulting key in secp256k1_ec_seckey_tweak_add and
     * secp256k1_ec_pubkey_tweak_add is 0 the functions fail and in the latter
     * case the pubkey is zeroized. */
    memcpy(ctmp, orderc, 32);
    ctmp[31] = 0x40;
    memset(ctmp2, 0, 32);
    ctmp2[31] = 1;
    CHECK(secp256k1_ec_seckey_tweak_add(CTX, ctmp2, ctmp) == 0);
    CHECK(secp256k1_memcmp_var(zeros, ctmp2, 32) == 0);
    ctmp2[31] = 1;
    CHECK(secp256k1_ec_pubkey_tweak_add(CTX, &pubkey, ctmp2) == 0);
    CHECK(secp256k1_memcmp_var(&pubkey, zeros, sizeof(pubkey)) == 0);
    memcpy(&pubkey, &pubkey2, sizeof(pubkey));
    /* Tweak computation wraps and results in a key of 1. */
    ctmp2[31] = 2;
    CHECK(secp256k1_ec_seckey_tweak_add(CTX, ctmp2, ctmp) == 1);
    CHECK(secp256k1_memcmp_var(ctmp2, zeros, 31) == 0 && ctmp2[31] == 1);
    ctmp2[31] = 2;
    CHECK(secp256k1_ec_pubkey_tweak_add(CTX, &pubkey, ctmp2) == 1);
    ctmp2[31] = 1;
    CHECK(secp256k1_ec_pubkey_create(CTX, &pubkey2, ctmp2) == 1);
    CHECK(secp256k1_memcmp_var(&pubkey, &pubkey2, sizeof(pubkey)) == 0);
    /* Tweak mul * 2 = 1+1. */
    CHECK(secp256k1_ec_pubkey_tweak_add(CTX, &pubkey, ctmp2) == 1);
    ctmp2[31] = 2;
    CHECK(secp256k1_ec_pubkey_tweak_mul(CTX, &pubkey2, ctmp2) == 1);
    CHECK(secp256k1_memcmp_var(&pubkey, &pubkey2, sizeof(pubkey)) == 0);
    /* Test argument errors. */
    ecount = 0;
    secp256k1_context_set_illegal_callback(CTX, counting_illegal_callback_fn, &ecount);
    CHECK(ecount == 0);
    /* Zeroize pubkey on parse error. */
    memset(&pubkey, 0, 32);
    CHECK(secp256k1_ec_pubkey_tweak_add(CTX, &pubkey, ctmp2) == 0);
    CHECK(ecount == 1);
    CHECK(secp256k1_memcmp_var(&pubkey, zeros, sizeof(pubkey)) == 0);
    memcpy(&pubkey, &pubkey2, sizeof(pubkey));
    memset(&pubkey2, 0, 32);
    CHECK(secp256k1_ec_pubkey_tweak_mul(CTX, &pubkey2, ctmp2) == 0);
    CHECK(ecount == 2);
    CHECK(secp256k1_memcmp_var(&pubkey2, zeros, sizeof(pubkey2)) == 0);
    /* Plain argument errors. */
    ecount = 0;
    CHECK(secp256k1_ec_seckey_verify(CTX, ctmp) == 1);
    CHECK(ecount == 0);
    CHECK(secp256k1_ec_seckey_verify(CTX, NULL) == 0);
    CHECK(ecount == 1);
    ecount = 0;
    memset(ctmp2, 0, 32);
    ctmp2[31] = 4;
    CHECK(secp256k1_ec_pubkey_tweak_add(CTX, NULL, ctmp2) == 0);
    CHECK(ecount == 1);
    CHECK(secp256k1_ec_pubkey_tweak_add(CTX, &pubkey, NULL) == 0);
    CHECK(ecount == 2);
    ecount = 0;
    memset(ctmp2, 0, 32);
    ctmp2[31] = 4;
    CHECK(secp256k1_ec_pubkey_tweak_mul(CTX, NULL, ctmp2) == 0);
    CHECK(ecount == 1);
    CHECK(secp256k1_ec_pubkey_tweak_mul(CTX, &pubkey, NULL) == 0);
    CHECK(ecount == 2);
    ecount = 0;
    memset(ctmp2, 0, 32);
    CHECK(secp256k1_ec_seckey_tweak_add(CTX, NULL, ctmp2) == 0);
    CHECK(ecount == 1);
    CHECK(secp256k1_ec_seckey_tweak_add(CTX, ctmp, NULL) == 0);
    CHECK(ecount == 2);
    ecount = 0;
    memset(ctmp2, 0, 32);
    ctmp2[31] = 1;
    CHECK(secp256k1_ec_seckey_tweak_mul(CTX, NULL, ctmp2) == 0);
    CHECK(ecount == 1);
    CHECK(secp256k1_ec_seckey_tweak_mul(CTX, ctmp, NULL) == 0);
    CHECK(ecount == 2);
    ecount = 0;
    CHECK(secp256k1_ec_pubkey_create(CTX, NULL, ctmp) == 0);
    CHECK(ecount == 1);
    memset(&pubkey, 1, sizeof(pubkey));
    CHECK(secp256k1_ec_pubkey_create(CTX, &pubkey, NULL) == 0);
    CHECK(ecount == 2);
    CHECK(secp256k1_memcmp_var(&pubkey, zeros, sizeof(secp256k1_pubkey)) == 0);
    /* secp256k1_ec_pubkey_combine tests. */
    ecount = 0;
    pubkeys[0] = &pubkey_one;
    SECP256K1_CHECKMEM_UNDEFINE(&pubkeys[0], sizeof(secp256k1_pubkey *));
    SECP256K1_CHECKMEM_UNDEFINE(&pubkeys[1], sizeof(secp256k1_pubkey *));
    SECP256K1_CHECKMEM_UNDEFINE(&pubkeys[2], sizeof(secp256k1_pubkey *));
    memset(&pubkey, 255, sizeof(secp256k1_pubkey));
    SECP256K1_CHECKMEM_UNDEFINE(&pubkey, sizeof(secp256k1_pubkey));
    CHECK(secp256k1_ec_pubkey_combine(CTX, &pubkey, pubkeys, 0) == 0);
    SECP256K1_CHECKMEM_CHECK(&pubkey, sizeof(secp256k1_pubkey));
    CHECK(secp256k1_memcmp_var(&pubkey, zeros, sizeof(secp256k1_pubkey)) == 0);
    CHECK(ecount == 1);
    CHECK(secp256k1_ec_pubkey_combine(CTX, NULL, pubkeys, 1) == 0);
    CHECK(secp256k1_memcmp_var(&pubkey, zeros, sizeof(secp256k1_pubkey)) == 0);
    CHECK(ecount == 2);
    memset(&pubkey, 255, sizeof(secp256k1_pubkey));
    SECP256K1_CHECKMEM_UNDEFINE(&pubkey, sizeof(secp256k1_pubkey));
    CHECK(secp256k1_ec_pubkey_combine(CTX, &pubkey, NULL, 1) == 0);
    SECP256K1_CHECKMEM_CHECK(&pubkey, sizeof(secp256k1_pubkey));
    CHECK(secp256k1_memcmp_var(&pubkey, zeros, sizeof(secp256k1_pubkey)) == 0);
    CHECK(ecount == 3);
    pubkeys[0] = &pubkey_negone;
    memset(&pubkey, 255, sizeof(secp256k1_pubkey));
    SECP256K1_CHECKMEM_UNDEFINE(&pubkey, sizeof(secp256k1_pubkey));
    CHECK(secp256k1_ec_pubkey_combine(CTX, &pubkey, pubkeys, 1) == 1);
    SECP256K1_CHECKMEM_CHECK(&pubkey, sizeof(secp256k1_pubkey));
    CHECK(secp256k1_memcmp_var(&pubkey, zeros, sizeof(secp256k1_pubkey)) > 0);
    CHECK(ecount == 3);
    len = 33;
    CHECK(secp256k1_ec_pubkey_serialize(CTX, ctmp, &len, &pubkey, SECP256K1_EC_COMPRESSED) == 1);
    CHECK(secp256k1_ec_pubkey_serialize(CTX, ctmp2, &len, &pubkey_negone, SECP256K1_EC_COMPRESSED) == 1);
    CHECK(secp256k1_memcmp_var(ctmp, ctmp2, 33) == 0);
    /* Result is infinity. */
    pubkeys[0] = &pubkey_one;
    pubkeys[1] = &pubkey_negone;
    memset(&pubkey, 255, sizeof(secp256k1_pubkey));
    SECP256K1_CHECKMEM_UNDEFINE(&pubkey, sizeof(secp256k1_pubkey));
    CHECK(secp256k1_ec_pubkey_combine(CTX, &pubkey, pubkeys, 2) == 0);
    SECP256K1_CHECKMEM_CHECK(&pubkey, sizeof(secp256k1_pubkey));
    CHECK(secp256k1_memcmp_var(&pubkey, zeros, sizeof(secp256k1_pubkey)) == 0);
    CHECK(ecount == 3);
    /* Passes through infinity but comes out one. */
    pubkeys[2] = &pubkey_one;
    memset(&pubkey, 255, sizeof(secp256k1_pubkey));
    SECP256K1_CHECKMEM_UNDEFINE(&pubkey, sizeof(secp256k1_pubkey));
    CHECK(secp256k1_ec_pubkey_combine(CTX, &pubkey, pubkeys, 3) == 1);
    SECP256K1_CHECKMEM_CHECK(&pubkey, sizeof(secp256k1_pubkey));
    CHECK(secp256k1_memcmp_var(&pubkey, zeros, sizeof(secp256k1_pubkey)) > 0);
    CHECK(ecount == 3);
    len = 33;
    CHECK(secp256k1_ec_pubkey_serialize(CTX, ctmp, &len, &pubkey, SECP256K1_EC_COMPRESSED) == 1);
    CHECK(secp256k1_ec_pubkey_serialize(CTX, ctmp2, &len, &pubkey_one, SECP256K1_EC_COMPRESSED) == 1);
    CHECK(secp256k1_memcmp_var(ctmp, ctmp2, 33) == 0);
    /* Adds to two. */
    pubkeys[1] = &pubkey_one;
    memset(&pubkey, 255, sizeof(secp256k1_pubkey));
    SECP256K1_CHECKMEM_UNDEFINE(&pubkey, sizeof(secp256k1_pubkey));
    CHECK(secp256k1_ec_pubkey_combine(CTX, &pubkey, pubkeys, 2) == 1);
    SECP256K1_CHECKMEM_CHECK(&pubkey, sizeof(secp256k1_pubkey));
    CHECK(secp256k1_memcmp_var(&pubkey, zeros, sizeof(secp256k1_pubkey)) > 0);
    CHECK(ecount == 3);
    secp256k1_context_set_illegal_callback(CTX, NULL, NULL);
}